

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

void show_conduct(int final)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *middle;
  char **ppcVar4;
  char *pcVar5;
  int cdt;
  long lVar6;
  char *pcVar7;
  menulist menu;
  char buf [256];
  
  init_menulist(&menu);
  pcVar7 = "";
  if (final == 0) {
    pcVar7 = "have ";
  }
  ppcVar4 = &conducts[0].failtxt;
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    cdt = (int)lVar6;
    bVar1 = successful_cdt(cdt);
    if (bVar1 == '\0') {
      bVar1 = intended_cdt(cdt);
      if (bVar1 != '\0') {
        pcVar3 = *ppcVar4;
        pcVar5 = "You ";
        middle = pcVar7;
        goto LAB_0015955d;
      }
    }
    else {
      bVar1 = superfluous_cdt(cdt);
      if (bVar1 == '\0') {
        pcVar5 = ppcVar4[-4];
        pcVar3 = ppcVar4[-1];
        middle = ppcVar4[(ulong)(final != 0) - 3];
LAB_0015955d:
        enlght_line(&menu,pcVar5,middle,pcVar3);
      }
    }
    ppcVar4 = ppcVar4 + 9;
  }
  bVar1 = failed_cdt(0);
  if ((bVar1 != '\0') || (bVar1 = failed_cdt(1), bVar1 != '\0')) {
    if (u.uconduct.killer == 0) {
      pcVar7 = "never ";
      if (final == 0) {
        pcVar7 = "have never ";
      }
      pcVar5 = "killed a creature";
    }
    else {
      pcVar3 = "s";
      if (u.uconduct.killer == 1) {
        pcVar3 = "";
      }
      pcVar5 = buf;
      sprintf(pcVar5,"killed %u creature%s",(ulong)u.uconduct.killer,pcVar3);
    }
    enlght_line(&menu,"You ",pcVar7,pcVar5);
  }
  if (u.uconduct.weaphit == 0) {
    pcVar7 = "never ";
    if (final == 0) {
      pcVar7 = "have never ";
    }
    pcVar5 = "hit with a wielded weapon";
LAB_00159692:
    enlght_line(&menu,"You ",pcVar7,pcVar5);
  }
  else if ((final != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.weaphit == 1) {
      pcVar7 = "";
    }
    pcVar5 = buf;
    sprintf(pcVar5,"used a wielded weapon %u time%s",(ulong)u.uconduct.weaphit,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    goto LAB_00159692;
  }
  if (u.uconduct.literate != 0 && (final != 0 || flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.literate == 1) {
      pcVar7 = "";
    }
    sprintf(buf,"read items or engraved %u time%s",(ulong)u.uconduct.literate,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&menu,"You ",pcVar7,buf);
  }
  if (u.uconduct.armoruses != 0 && (flags.debug != '\0' || final != 0)) {
    pcVar7 = "s";
    if (u.uconduct.armoruses == 1) {
      pcVar7 = "";
    }
    sprintf(buf,"put on armor %u time%s",(ulong)u.uconduct.armoruses,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&menu,"You ",pcVar7,buf);
  }
  if ((u.uconduct.unracearmor == 0) && (u.uconduct.armoruses != 0)) {
    sprintf(buf,"wearing only %s armor",urace.adj);
    pcVar7 = "have been ";
    if (final != 0) {
      pcVar7 = "were ";
    }
    enlght_line(&menu,"You ",pcVar7,buf);
  }
  uVar2 = num_genocides();
  if (uVar2 == 0) {
    pcVar7 = "have never ";
    if (final != 0) {
      pcVar7 = "never ";
    }
    pcVar5 = "genocided any monsters";
  }
  else {
    pcVar5 = buf;
    sprintf(pcVar5,"genocided %d type%s of monster%s",(ulong)uVar2);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
  }
  enlght_line(&menu,"You ",pcVar7,pcVar5);
  if (u.uconduct.polypiles == 0) {
    pcVar7 = "have never ";
    if (final != 0) {
      pcVar7 = "never ";
    }
    pcVar5 = "polymorphed an object";
LAB_001598bc:
    enlght_line(&menu,"You ",pcVar7,pcVar5);
  }
  else if ((final != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.polypiles == 1) {
      pcVar7 = "";
    }
    pcVar5 = buf;
    sprintf(pcVar5,"polymorphed %u item%s",(ulong)u.uconduct.polypiles,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    goto LAB_001598bc;
  }
  if (u.uconduct.polyselfs == 0) {
    pcVar7 = "have never ";
    if (final != 0) {
      pcVar7 = "never ";
    }
    pcVar5 = "changed form";
LAB_0015993c:
    enlght_line(&menu,"You ",pcVar7,pcVar5);
  }
  else if ((final != 0) || (flags.debug != '\0')) {
    pcVar7 = "s";
    if (u.uconduct.polyselfs == 1) {
      pcVar7 = "";
    }
    pcVar5 = buf;
    sprintf(pcVar5,"changed form %u time%s",(ulong)u.uconduct.polyselfs,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    goto LAB_0015993c;
  }
  if (u.uconduct.wishes == 0) {
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    pcVar5 = "used no wishes";
LAB_00159a41:
    enlght_line(&menu,"You ",pcVar7,pcVar5);
  }
  else {
    pcVar5 = "es";
    pcVar7 = "es";
    if (u.uconduct.wishes == 1) {
      pcVar7 = "";
    }
    sprintf(buf,"used %u wish%s",(ulong)u.uconduct.wishes,pcVar7);
    pcVar7 = "";
    if (final == 0) {
      pcVar7 = "have ";
    }
    enlght_line(&menu,"You ",pcVar7,buf);
    if (u.uconduct.wishmagic != 0) {
      if (u.uconduct.wishmagic == 1) {
        pcVar5 = "";
      }
      sprintf(buf,"used %u wish%s for magical items",(ulong)u.uconduct.wishmagic,pcVar5);
      enlght_line(&menu,"You ",pcVar7,buf);
    }
    if (u.uconduct.wisharti == 0) {
      pcVar7 = "have not wished";
      if (final != 0) {
        pcVar7 = "did not wish";
      }
      pcVar5 = " for any artifacts";
      goto LAB_00159a41;
    }
  }
  pcVar7 = "have ";
  if (flags.elbereth_enabled == '\0') {
    pcVar5 = "";
    if (final == 0) {
      pcVar5 = "have ";
    }
    pcVar3 = "abstained from Elbereth\'s help";
  }
  else if (u.uconduct.elbereths == 0) {
    pcVar5 = "have never ";
    if (final != 0) {
      pcVar5 = "never ";
    }
    pcVar3 = "wrote Elbereth\'s name";
  }
  else {
    pcVar5 = "s";
    if (u.uconduct.elbereths == 1) {
      pcVar5 = "";
    }
    pcVar3 = buf;
    sprintf(pcVar3," Elbereth\'s name %u time%s",(ulong)u.uconduct.elbereths,pcVar5);
    pcVar5 = "have written";
    if (final != 0) {
      pcVar5 = "wrote";
    }
  }
  enlght_line(&menu,"You ",pcVar5,pcVar3);
  if (u.uconduct.bones == 0 || flags.debug == '\0' && final == 0) {
    if (flags.debug != '\0' || final != 0) {
      pcVar5 = "have never ";
      if (final != 0) {
        pcVar5 = "never ";
      }
      pcVar3 = "encountered a bones level";
      goto LAB_00159b79;
    }
  }
  else {
    pcVar5 = "s";
    if (u.uconduct.bones == 1) {
      pcVar5 = "";
    }
    pcVar3 = buf;
    sprintf(pcVar3,"encountered %u bones level%s",(ulong)u.uconduct.bones,pcVar5);
    pcVar5 = "";
    if (final == 0) {
      pcVar5 = "have ";
    }
LAB_00159b79:
    enlght_line(&menu,"You ",pcVar5,pcVar3);
  }
  if (u.uconduct.sokoban != 0 || flags.debug == '\0' && final == 0) {
    if (flags.debug == '\0' && final == 0) goto LAB_00159c0e;
    pcVar5 = "s";
    if (u.uconduct.sokoban == 1) {
      pcVar5 = "";
    }
    pcVar3 = buf;
    sprintf(pcVar3,"used %u Sokoban shortcut%s",(ulong)u.uconduct.sokoban,pcVar5);
    if (final != 0) {
      pcVar7 = "";
    }
  }
  else {
    pcVar7 = "have never ";
    if (final != 0) {
      pcVar7 = "never ";
    }
    pcVar3 = "used any Sokoban shortcuts";
  }
  enlght_line(&menu,"You ",pcVar7,pcVar3);
LAB_00159c0e:
  display_menu(menu.items,menu.icount,"Voluntary challenges:",0,(int *)0x0);
  free(menu.items);
  return;
}

Assistant:

void show_conduct(int final)
{
	char buf[BUFSZ];
	int ngenocided;
	int cdt;
	struct menulist menu;

	/* Create the conduct window */
	init_menulist(&menu);

	/* List all major conducts. */
	for (cdt = FIRST_CONDUCT; cdt <= LAST_CONDUCT; cdt++) {
	    if (successful_cdt(cdt)) {
		if (!superfluous_cdt(cdt)) {
		    enl_msg(&menu,
			    conducts[cdt].prefix,	/* "You "       */
			    conducts[cdt].presenttxt,	/* "have been"  */
			    conducts[cdt].pasttxt,	/* "were"       */
			    conducts[cdt].suffix);	/* "a pacifist" */
		}
	    } else if (intended_cdt(cdt)) {
		/* "pretended to be a pacifist" */
		you_have_X(&menu, conducts[cdt].failtxt);
	    }
	}
	if (failed_cdt(CONDUCT_PACIFISM) || failed_cdt(CONDUCT_SADISM)) {
	    if (u.uconduct.killer == 0) {
		you_have_never(&menu, "killed a creature");
	    } else {
		sprintf(buf, "killed %u creature%s", u.uconduct.killer,
			plur(u.uconduct.killer));
		you_have_X(&menu, buf);
	    }
	}

	/* Now list the remaining statistical details. */

	if (!u.uconduct.weaphit)
	    you_have_never(&menu, "hit with a wielded weapon");
	else if (wizard || final) {
	    sprintf(buf, "used a wielded weapon %u time%s",
		    u.uconduct.weaphit, plur(u.uconduct.weaphit));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.literate) {
	    sprintf(buf, "read items or engraved %u time%s",
		    u.uconduct.literate, plur(u.uconduct.literate));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.armoruses) {
	    sprintf(buf, "put on armor %u time%s",
		    u.uconduct.armoruses, plur(u.uconduct.armoruses));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.unracearmor && u.uconduct.armoruses > 0) {
	    sprintf(buf, "wearing only %s armor", urace.adj);
	    you_have_been(&menu, buf);
	}

	ngenocided = num_genocides();
	if (ngenocided == 0) {
	    you_have_never(&menu, "genocided any monsters");
	} else {
	    sprintf(buf, "genocided %d type%s of monster%s",
		    ngenocided, plur(ngenocided), plur(ngenocided));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polypiles)
	    you_have_never(&menu, "polymorphed an object");
	else if ((wizard || final)) {
	    sprintf(buf, "polymorphed %u item%s",
		    u.uconduct.polypiles, plur(u.uconduct.polypiles));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polyselfs)
	    you_have_never(&menu, "changed form");
	else if ((wizard || final)) {
	    sprintf(buf, "changed form %u time%s",
		    u.uconduct.polyselfs, plur(u.uconduct.polyselfs));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.wishes)
	    you_have_X(&menu, "used no wishes");
	else {
	    sprintf(buf, "used %u wish%s",
		    u.uconduct.wishes, (u.uconduct.wishes > 1L) ? "es" : "");
	    you_have_X(&menu, buf);

	    if (u.uconduct.wishmagic) {
		sprintf(buf, "used %u wish%s for magical items",
			u.uconduct.wishmagic, u.uconduct.wishmagic > 1 ? "es" : "");
		you_have_X(&menu, buf);
	    }

	    if (!u.uconduct.wisharti)
		enl_msg(&menu, You_, "have not wished", "did not wish",
			" for any artifacts");
	}

	if (flags.elbereth_enabled) {
	    if (!u.uconduct.elbereths)
		you_have_never(&menu, "wrote Elbereth's name");
	    else {
		sprintf(buf, " Elbereth's name %u time%s",
			u.uconduct.elbereths, plur(u.uconduct.elbereths));
		enl_msg(&menu, You_, "have written", "wrote", buf);
	    }
	} else {
	    you_have_X(&menu, "abstained from Elbereth's help");
	}

	if ((wizard || final) && u.uconduct.bones) {
	    sprintf(buf, "encountered %u bones level%s",
		    u.uconduct.bones, plur(u.uconduct.bones));
	    you_have_X(&menu, buf);
	} else if (wizard || final) {
	    you_have_never(&menu, "encountered a bones level");
	}

	if ((wizard || final) && !u.uconduct.sokoban) {
	    you_have_never(&menu, "used any Sokoban shortcuts");
	} else if (wizard || final) {
	    sprintf(buf, "used %u Sokoban shortcut%s",
		    u.uconduct.sokoban, plur(u.uconduct.sokoban));
	    you_have_X(&menu, buf);
	}

	/* Pop up the window and wait for a key */
	display_menu(menu.items, menu.icount, "Voluntary challenges:", PICK_NONE, NULL);
	free(menu.items);
}